

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

ASN1_TIME * X509_time_adj_ex(ASN1_TIME *s,int offset_day,long offset_sec,time_t *in_tm)

{
  ASN1_TIME *pAVar1;
  undefined8 local_30;
  int64_t t;
  time_t *in_tm_local;
  long offset_sec_local;
  int offset_day_local;
  ASN1_TIME *s_local;
  
  if (in_tm == (time_t *)0x0) {
    local_30 = time((time_t *)0x0);
  }
  else {
    local_30 = *in_tm;
  }
  pAVar1 = ASN1_TIME_adj((ASN1_TIME *)s,local_30,offset_day,offset_sec);
  return pAVar1;
}

Assistant:

ASN1_TIME *X509_time_adj_ex(ASN1_TIME *s, int offset_day, long offset_sec,
                            const time_t *in_tm) {
  int64_t t = 0;

  if (in_tm) {
    t = *in_tm;
  } else {
    t = time(NULL);
  }

  return ASN1_TIME_adj(s, t, offset_day, offset_sec);
}